

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UdpOutputPortDeclSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UdpOutputPortDeclSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::EqualsValueClauseSyntax*>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,EqualsValueClauseSyntax **args_4)

{
  Token reg;
  Token keyword;
  UdpOutputPortDeclSyntax *pUVar1;
  undefined8 *in_RCX;
  Token *in_RDX;
  undefined8 *in_R8;
  EqualsValueClauseSyntax *in_R9;
  size_t in_stack_ffffffffffffff88;
  UdpOutputPortDeclSyntax *in_stack_ffffffffffffff90;
  BumpAllocator *in_stack_ffffffffffffff98;
  
  pUVar1 = (UdpOutputPortDeclSyntax *)
           allocate(in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90,
                    in_stack_ffffffffffffff88);
  keyword.info = (Info *)*in_RCX;
  keyword._0_8_ = in_R8[1];
  reg.info = (Info *)*in_R8;
  reg._0_8_ = pUVar1;
  slang::syntax::UdpOutputPortDeclSyntax::UdpOutputPortDeclSyntax
            (in_stack_ffffffffffffff90,
             *(SyntaxList<slang::syntax::AttributeInstanceSyntax> **)&in_R9->super_SyntaxNode,
             keyword,reg,*in_RDX,in_R9);
  return pUVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }